

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_profile(sqlite3 *db,_func_void_void_ptr_char_ptr_sqlite_uint64 *xProfile,void *pArg)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  void *pOld;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14c464);
  pvVar1 = *(void **)(in_RDI + 0x108);
  *(undefined8 *)(in_RDI + 0x100) = in_RSI;
  *(undefined8 *)(in_RDI + 0x108) = in_RDX;
  *(byte *)(in_RDI + 0x6e) = *(byte *)(in_RDI + 0x6e) & 0xf;
  if (*(long *)(in_RDI + 0x100) != 0) {
    *(byte *)(in_RDI + 0x6e) = *(byte *)(in_RDI + 0x6e) | 0x80;
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x14c4d5);
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_profile(
  sqlite3 *db,
  void (*xProfile)(void*,const char*,sqlite_uint64),
  void *pArg
){
  void *pOld;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pOld = db->pProfileArg;
  db->xProfile = xProfile;
  db->pProfileArg = pArg;
  db->mTrace &= SQLITE_TRACE_NONLEGACY_MASK;
  if( db->xProfile ) db->mTrace |= SQLITE_TRACE_XPROFILE;
  sqlite3_mutex_leave(db->mutex);
  return pOld;
}